

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

double __thiscall tcu::FloatFormat::round(FloatFormat *this,double __x)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  double dVar3;
  int exp;
  int local_1c;
  
  local_1c = 0;
  dVar3 = deFractExp(__x,&local_1c);
  iVar1 = this->m_minExp - local_1c;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  iVar2 = this->m_fractionBits - iVar2;
  dVar3 = ldexp(dVar3,iVar2);
  if (in_ESI == 0) {
    dVar3 = floor(dVar3);
  }
  else {
    dVar3 = ceil(dVar3);
  }
  dVar3 = ldexp(dVar3,local_1c - iVar2);
  return dVar3;
}

Assistant:

double FloatFormat::round (double d, bool upward) const
{
	int				exp			= 0;
	const double	frac		= deFractExp(d, &exp);
	const int		shift		= exponentShift(exp);
	const double	shiftFrac	= deLdExp(frac, shift);
	const double	roundFrac	= upward ? deCeil(shiftFrac) : deFloor(shiftFrac);

	return deLdExp(roundFrac, exp - shift);
}